

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O0

ulong X509_NAME_hash(X509_NAME *x)

{
  int iVar1;
  uchar local_38 [8];
  uint8_t md [20];
  X509_NAME *x_local;
  
  iVar1 = i2d_X509_NAME(x,(uchar **)0x0);
  if (iVar1 < 0) {
    x_local._4_4_ = 0;
  }
  else {
    SHA1(x->canon_enc,(long)x->canon_enclen,local_38);
    x_local._4_4_ = CRYPTO_load_u32_le(local_38);
  }
  return (ulong)x_local._4_4_;
}

Assistant:

uint32_t X509_NAME_hash(X509_NAME *x) {
  // Make sure the X509_NAME structure contains a valid cached encoding.
  if (i2d_X509_NAME(x, NULL) < 0) {
    return 0;
  }

  uint8_t md[SHA_DIGEST_LENGTH];
  SHA1(x->canon_enc, x->canon_enclen, md);
  return CRYPTO_load_u32_le(md);
}